

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

void print_tests(FILE *stream)

{
  _func_int *p_Var1;
  task_entry_t *ptVar2;
  int iVar3;
  _func_int **pp_Var4;
  task_entry_t *ptVar5;
  task_entry_t *ptVar6;
  size_t __nmemb;
  char *__s;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  task_entry_t *helpers [1024];
  long local_2038 [1025];
  
  if (TASKS[0].main == (_func_int *)0x0) {
    __nmemb = 0;
  }
  else {
    pp_Var4 = &TASKS[1].main;
    __nmemb = 0;
    do {
      __nmemb = __nmemb + 1;
      p_Var1 = *pp_Var4;
      pp_Var4 = pp_Var4 + 5;
    } while (p_Var1 != (_func_int *)0x0);
  }
  qsort(TASKS,__nmemb,0x28,compare_task);
  if (TASKS[0].main != (_func_int *)0x0) {
    ptVar6 = TASKS;
    do {
      if (ptVar6->is_helper == 0) {
        if (TASKS[0].main == (_func_int *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          ptVar5 = TASKS;
          plVar7 = local_2038;
          do {
            if ((ptVar5->is_helper != 0) &&
               (iVar3 = strcmp(ptVar5->task_name,ptVar6->task_name), iVar3 == 0)) {
              *plVar7 = (long)ptVar5;
              plVar7 = plVar7 + 1;
              uVar8 = (ulong)((int)uVar8 + 1);
            }
            ptVar2 = ptVar5 + 1;
            ptVar5 = ptVar5 + 1;
          } while (ptVar2->main != (_func_int *)0x0);
        }
        __s = ptVar6->task_name;
        if ((int)uVar8 != 0) {
          printf("%-25s (helpers:");
          __s = ")";
          if (0 < (int)uVar8) {
            uVar9 = 0;
            do {
              printf(" %s",*(undefined8 *)(local_2038[uVar9] + 8));
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            __s = ")";
          }
        }
        puts(__s);
      }
      ptVar5 = ptVar6 + 1;
      ptVar6 = ptVar6 + 1;
    } while (ptVar5->main != (_func_int *)0x0);
  }
  return;
}

Assistant:

void print_tests(FILE* stream) {
  const task_entry_t* helpers[1024];
  const task_entry_t* task;
  int n_helpers;
  int n_tasks;
  int i;

  for (n_tasks = 0, task = TASKS; task->main; n_tasks++, task++);
  qsort(TASKS, n_tasks, sizeof(TASKS[0]), compare_task);

  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    n_helpers = find_helpers(task, helpers);
    if (n_helpers) {
      printf("%-25s (helpers:", task->task_name);
      for (i = 0; i < n_helpers; i++) {
        printf(" %s", helpers[i]->process_name);
      }
      printf(")\n");
    } else {
      printf("%s\n", task->task_name);
    }
  }
}